

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.cpp
# Opt level: O2

bool __thiscall zmq::pipe_t::check_write(pipe_t *this)

{
  bool bVar1;
  
  bVar1 = false;
  if ((this->_out_active == true) && (this->_state == active)) {
    bVar1 = true;
    if ((0 < (long)this->_hwm) &&
       ((ulong)(long)this->_hwm <= this->_msgs_written - this->_peers_msgs_read)) {
      this->_out_active = false;
      return false;
    }
  }
  return bVar1;
}

Assistant:

bool zmq::pipe_t::check_write ()
{
    if (unlikely (!_out_active || _state != active))
        return false;

    const bool full = !check_hwm ();

    if (unlikely (full)) {
        _out_active = false;
        return false;
    }

    return true;
}